

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

uint8_t * google::protobuf::internal::SerializeInternalToArray
                    (uint8_t *base,FieldMetadata *field_metadata_table,int32_t num_fields,
                    bool is_deterministic,uint8_t *buffer)

{
  uint uVar1;
  int iVar2;
  ArrayOutput *output;
  ulong uVar3;
  SingularFieldHelper<11> *this;
  uint32_t *has_bits_array;
  bool bVar4;
  ArrayOutput array_output;
  ArrayOutputStream array_stream;
  CodedOutputStream output_stream;
  
  uVar3 = 0;
  array_output.ptr = buffer;
  array_output.is_deterministic = is_deterministic;
  if (0 < num_fields) {
    uVar3 = (ulong)(uint)num_fields;
  }
  do {
    bVar4 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar4) {
      return array_output.ptr;
    }
    uVar1 = field_metadata_table->type;
    if (0x69 < (ulong)uVar1) {
switchD_0033152a_caseD_12:
      SerializeNotImplemented(uVar1);
      goto LAB_00331d82;
    }
    this = (SingularFieldHelper<11> *)(base + field_metadata_table->offset);
    output = (ArrayOutput *)
             ((long)&switchD_0033152a::switchdataD_00423198 +
             (long)(int)(&switchD_0033152a::switchdataD_00423198)[uVar1]);
    switch(uVar1) {
    case 0:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00331d4c:
        SingularFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 1:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00331c87:
        SingularFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 2:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0033196e:
        SingularFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 3:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_003319f0:
        SingularFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 4:
      uVar1 = *(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
              (field_metadata_table->has_offset & 0x1f) & 1;
      goto joined_r0x003318dc;
    case 5:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00331b0c:
        SingularFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 6:
      uVar1 = *(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
              (field_metadata_table->has_offset & 0x1f) & 1;
      goto joined_r0x003318ce;
    case 7:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_003318fd:
        SingularFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 8:
    case 0xb:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0033158f:
        SingularFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 9:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00331946:
        SingularFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 10:
      output = (ArrayOutput *)
               (ulong)*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4);
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00331cff:
        SingularFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,(FieldMetadata *)&array_output,output);
      }
      break;
    case 0xc:
      uVar1 = *(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
              (field_metadata_table->has_offset & 0x1f) & 1;
      goto joined_r0x003319df;
    case 0xd:
      uVar1 = *(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
              (field_metadata_table->has_offset & 0x1f) & 1;
      goto joined_r0x003317c1;
    case 0xe:
      uVar1 = *(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
              (field_metadata_table->has_offset & 0x1f) & 1;
      goto joined_r0x00331896;
    case 0xf:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00331d6c:
        SingularFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x10:
      uVar1 = *(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
              (field_metadata_table->has_offset & 0x1f) & 1;
      goto joined_r0x00331cc0;
    case 0x11:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00331bdc:
        SingularFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    default:
      goto switchD_0033152a_caseD_12;
    case 0x14:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_00331b29:
        SingularFieldHelper<21>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x15:
      if ((*(double *)this != 0.0) || (NAN(*(double *)this))) goto LAB_00331d4c;
      break;
    case 0x16:
      if ((*(float *)this != 0.0) || (NAN(*(float *)this))) goto LAB_00331c87;
      break;
    case 0x17:
      if (*(long *)this != 0) goto LAB_0033196e;
      break;
    case 0x18:
      if (*(long *)this != 0) goto LAB_003319f0;
      break;
    case 0x19:
      uVar1 = *(uint *)this;
joined_r0x003318dc:
      if (uVar1 != 0) {
LAB_00331a18:
        SingularFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x1a:
      if (*(long *)this != 0) goto LAB_00331b0c;
      break;
    case 0x1b:
      uVar1 = *(uint *)this;
joined_r0x003318ce:
      if (uVar1 != 0) {
LAB_00331af0:
        SingularFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x1c:
      if (*this != (SingularFieldHelper<11>)0x0) goto LAB_003318fd;
      break;
    case 0x1d:
    case 0x20:
      if (*(long *)((*(ulong *)this & 0xfffffffffffffffe) + 8) != 0) goto LAB_0033158f;
      break;
    case 0x1e:
      if (*(long *)this != 0) goto LAB_00331946;
      break;
    case 0x1f:
      if (*(long *)this != 0) goto LAB_00331cff;
      break;
    case 0x21:
      uVar1 = *(uint *)this;
joined_r0x003319df:
      if (uVar1 != 0) {
LAB_00331a40:
        SingularFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x22:
      uVar1 = *(uint *)this;
joined_r0x003317c1:
      if (uVar1 != 0) {
LAB_00331ba5:
        SingularFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x23:
      uVar1 = *(uint *)this;
joined_r0x00331896:
      if (uVar1 != 0) {
LAB_00331b63:
        SingularFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x24:
      if (*(long *)this != 0) goto LAB_00331d6c;
      break;
    case 0x25:
      uVar1 = *(uint *)this;
joined_r0x00331cc0:
      if (uVar1 != 0) {
LAB_00331cc6:
        SingularFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x26:
      if (*(long *)this != 0) goto LAB_00331bdc;
      break;
    case 0x29:
      if (*(long *)(this + 8) != 0) goto LAB_00331b29;
      break;
    case 0x2a:
      RepeatedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x2b:
      RepeatedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x2c:
      RepeatedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x2d:
      RepeatedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x2e:
      RepeatedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x2f:
      RepeatedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x30:
      RepeatedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x31:
      RepeatedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x32:
    case 0x35:
    case 0x3e:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x33:
      RepeatedFieldHelper<10>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x34:
      RepeatedFieldHelper<11>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x36:
      RepeatedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x37:
      RepeatedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x38:
      RepeatedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x39:
      RepeatedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x3a:
      RepeatedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x3b:
      RepeatedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x3f:
      PackedFieldHelper<1>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x40:
      PackedFieldHelper<2>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x41:
      PackedFieldHelper<3>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x42:
      PackedFieldHelper<4>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x43:
      PackedFieldHelper<5>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x44:
      PackedFieldHelper<6>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x45:
      PackedFieldHelper<7>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x46:
      PackedFieldHelper<8>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x53:
      PackedFieldHelper<9>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x4b:
      PackedFieldHelper<13>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x4c:
      PackedFieldHelper<14>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x4d:
      PackedFieldHelper<15>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x4e:
      PackedFieldHelper<16>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x4f:
      PackedFieldHelper<17>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x50:
      PackedFieldHelper<18>::Serialize<google::protobuf::internal::ArrayOutput>
                (this,field_metadata_table,&array_output);
      break;
    case 0x54:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_00331d4c;
      break;
    case 0x55:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_00331c87;
      break;
    case 0x56:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0033196e;
      break;
    case 0x57:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_003319f0;
      break;
    case 0x58:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_00331a18;
    case 0x59:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_00331b0c;
      break;
    case 0x5a:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_00331af0;
    case 0x5b:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_003318fd;
      break;
    case 0x5c:
    case 0x5f:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0033158f;
      break;
    case 0x5d:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_00331946;
      break;
    case 0x5e:
      output = (ArrayOutput *)(ulong)field_metadata_table->has_offset;
      if (*(uint *)(base + (long)output) == field_metadata_table->tag >> 3) goto LAB_00331cff;
      break;
    case 0x60:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_00331a40;
    case 0x61:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_00331ba5;
    case 0x62:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_00331b63;
    case 99:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_00331d6c;
      break;
    case 100:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_00331cc6;
    case 0x65:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_00331bdc;
      break;
    case 0x68:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3) {
        OneOfFieldHelper<21>::Serialize<google::protobuf::internal::ArrayOutput>
                  (this,field_metadata_table,&array_output);
      }
      break;
    case 0x69:
      io::ArrayOutputStream::ArrayOutputStream(&array_stream,array_output.ptr,0x7fffffff,-1);
      io::CodedOutputStream::CodedOutputStream
                (&output_stream,&array_stream.super_ZeroCopyOutputStream);
      output_stream.impl_.is_serialization_deterministic_ = is_deterministic;
      (*(code *)field_metadata_table->ptr)
                (base,field_metadata_table->offset,field_metadata_table->tag,
                 field_metadata_table->has_offset,&output_stream);
      iVar2 = io::CodedOutputStream::ByteCount(&output_stream);
      array_output.ptr = array_output.ptr + iVar2;
      io::CodedOutputStream::~CodedOutputStream(&output_stream);
    }
LAB_00331d82:
    field_metadata_table = field_metadata_table + 1;
  } while( true );
}

Assistant:

uint8_t* SerializeInternalToArray(const uint8_t* base,
                                  const FieldMetadata* field_metadata_table,
                                  int32_t num_fields, bool is_deterministic,
                                  uint8_t* buffer) {
  ArrayOutput array_output = {buffer, is_deterministic};
  ArrayOutput* output = &array_output;
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8_t* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);
      SERIALIZERS_FOR_TYPE(FieldMetadata::kInlinedType);
      // Special cases
      case FieldMetadata::kSpecial: {
        io::ArrayOutputStream array_stream(array_output.ptr, INT_MAX);
        io::CodedOutputStream output_stream(&array_stream);
        output_stream.SetSerializationDeterministic(is_deterministic);
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, &output_stream);
        array_output.ptr += output_stream.ByteCount();
      } break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
  return array_output.ptr;
}